

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall SHA256_check::test_method(SHA256_check *this)

{
  int iVar1;
  string expected;
  string actual;
  ethash_h256_t input;
  ethash_h256_t out;
  undefined1 *local_1c0;
  size_t local_1b8;
  undefined1 local_1b0 [16];
  string local_1a0;
  pointer local_180;
  undefined1 *local_178;
  undefined1 local_170;
  undefined8 local_168;
  shared_count sStack_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  uint8_t local_128 [32];
  undefined **local_108;
  undefined1 local_100;
  undefined8 *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined ***local_d8;
  undefined1 **local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined ***local_b8;
  char *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined ***local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined ***local_78;
  pointer *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined ***local_58;
  char *local_50;
  uint8_t local_48 [32];
  
  builtin_memcpy(local_128,"~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~",0x20);
  sha3_256(local_48,0x20,local_128,0x20);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c0,"2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7"
             ,"");
  bytesToHexString_abi_cxx11_(&local_1a0,local_48,0x20);
  local_138 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x80);
  local_180 = local_1a0._M_dataplus._M_p;
  local_178 = local_1c0;
  if (local_1b8 == local_1a0._M_string_length) {
    if (local_1b8 == 0) {
      local_170 = true;
    }
    else {
      iVar1 = bcmp(local_1c0,local_1a0._M_dataplus._M_p,local_1b8);
      local_170 = iVar1 == 0;
    }
  }
  else {
    local_170 = false;
  }
  local_168 = 0;
  sStack_160.pi_ = (sp_counted_base *)0x0;
  local_d8 = &local_108;
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0013d750;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = "\nexpected: ";
  local_d0 = &local_178;
  local_b8 = &local_e8;
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_0013d8d0;
  local_98 = &local_c8;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_0013d910;
  local_b0 = "\n";
  local_78 = &local_a8;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_0013d950;
  local_90 = "actual: ";
  local_70 = &local_180;
  local_58 = &local_88;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_0013d990;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_0013d9d0;
  local_50 = "\n";
  local_158 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SHA256_check) {
	ethash_h256_t input;
	ethash_h256_t out;
	memcpy(&input, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	SHA3_256(&out, (uint8_t*)&input, 32);
	const std::string
			expected = "2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",
		actual = bytesToHexString((uint8_t*)&out, 32);
	BOOST_REQUIRE_MESSAGE(expected == actual,
			"\nexpected: " << expected.c_str() << "\n"
					<< "actual: " << actual.c_str() << "\n");
}